

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextdocument_p.cpp
# Opt level: O2

void __thiscall QTextDocumentPrivate::clear(QTextDocumentPrivate *this)

{
  QSet<QTextCursorPrivate_*> *this_00;
  QMap<int,_QTextObject_*> *this_01;
  bool bVar1;
  QTextDocument *this_02;
  Span *pSVar2;
  long lVar3;
  _Base_ptr p_Var4;
  QAbstractTextDocumentLayout *pQVar5;
  int _t2;
  iterator it;
  iterator iVar6;
  ulong uVar7;
  EVP_PKEY_CTX *ctx;
  long in_FS_OFFSET;
  piter local_58;
  qsizetype local_48;
  QHash<QTextCursorPrivate_*,_QHashDummyValue> local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_02 = *(QTextDocument **)&this->field_0x8;
  this_00 = &this->cursors;
  local_58 = (piter)QHash<QTextCursorPrivate_*,_QHashDummyValue>::begin(&this_00->q_hash);
  while( true ) {
    if (local_58.d == (Data<QHashPrivate::Node<QTextCursorPrivate_*,_QHashDummyValue>_> *)0x0 &&
        local_58.bucket == 0) break;
    pSVar2 = (local_58.d)->spans;
    uVar7 = local_58.bucket >> 7;
    lVar3 = *(long *)pSVar2[uVar7].entries[pSVar2[uVar7].offsets[(uint)local_58.bucket & 0x7f]].
                     storage.data;
    if (*(int *)(lVar3 + 0x18) != 0) {
      *(undefined4 *)(lVar3 + 0x18) = 0;
    }
    *(undefined4 *)(lVar3 + 0x24) = 0xffffffff;
    *(undefined8 *)(lVar3 + 0x1c) = 0;
    QHashPrivate::iterator<QHashPrivate::Node<QTextCursorPrivate_*,_QHashDummyValue>_>::operator++
              (&local_58);
  }
  local_40.d = (this_00->q_hash).d;
  if ((local_40.d != (Data *)0x0) &&
     (((local_40.d)->ref).atomic._q_value.super___atomic_base<int>._M_i != -1)) {
    LOCK();
    ((local_40.d)->ref).atomic._q_value.super___atomic_base<int>._M_i =
         ((local_40.d)->ref).atomic._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  QHash<QTextCursorPrivate_*,_QHashDummyValue>::clear(&this_00->q_hash);
  this_01 = &this->objects;
  it._M_node = (_Base_ptr)QMap<int,_QTextObject_*>::begin(this_01);
  while( true ) {
    iVar6 = QMap<int,_QTextObject_*>::end(this_01);
    if ((iterator)it._M_node == iVar6.i._M_node) break;
    p_Var4 = it._M_node[1]._M_parent;
    if (p_Var4 == (_Base_ptr)this->rtFrame) {
      it._M_node = (_Base_ptr)std::_Rb_tree_increment(it._M_node);
    }
    else {
      if (p_Var4 != (_Base_ptr)0x0) {
        (**(code **)(*(long *)p_Var4 + 0x20))();
      }
      it._M_node = (_Base_ptr)QMap<int,_QTextObject_*>::erase(this_01,it._M_node);
    }
  }
  QMap<int,_QTextObject_*>::clear(this_01);
  QString::clear(&this->title);
  clearUndoRedoStacks(this,UndoAndRedoStacks,false);
  local_58.d = (Data<QHashPrivate::Node<QTextCursorPrivate_*,_QHashDummyValue>_> *)(this->text).d.d;
  local_58.bucket = (size_t)(this->text).d.ptr;
  (this->text).d.d = (Data *)0x0;
  (this->text).d.ptr = (char16_t *)0x0;
  local_48 = (this->text).d.size;
  (this->text).d.size = 0;
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_58);
  this->unreachableCharacterCount = 0;
  this->modifiedState = 0;
  this->modified = false;
  QTextFormatCollection::clear(&this->formats);
  ctx = (EVP_PKEY_CTX *)0x0;
  _t2 = QFragmentMapData<QTextFragmentData>::length(&(this->fragments).data,0);
  QFragmentMap<QTextFragmentData>::clear(&this->fragments);
  QFragmentMap<QTextBlockData>::clear(&this->blocks);
  QMap<QUrl,_QVariant>::clear(&this->cachedResources);
  if (this->rtFrame != (QTextFrame *)0x0) {
    (**(code **)(*(long *)&this->rtFrame->super_QTextObject + 0x20))();
  }
  this->rtFrame = (QTextFrame *)0x0;
  init(this,ctx);
  QHash<QTextCursorPrivate_*,_QHashDummyValue>::operator=(&this_00->q_hash,&local_40);
  bVar1 = this->inContentsChange;
  this->inContentsChange = true;
  QTextDocument::contentsChange(this_02,0,_t2,0);
  this->inContentsChange = bVar1;
  pQVar5 = this->lout;
  if (pQVar5 != (QAbstractTextDocumentLayout *)0x0) {
    (**(code **)(*(long *)pQVar5 + 0x90))(pQVar5,0,_t2,0);
  }
  QHash<QTextCursorPrivate_*,_QHashDummyValue>::~QHash(&local_40);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTextDocumentPrivate::clear()
{
    Q_Q(QTextDocument);

    for (QTextCursorPrivate *curs : std::as_const(cursors)) {
        curs->setPosition(0);
        curs->currentCharFormat = -1;
        curs->anchor = 0;
        curs->adjusted_anchor = 0;
    }

    QSet<QTextCursorPrivate *> oldCursors = cursors;
    QT_TRY{
        cursors.clear();

        QMap<int, QTextObject *>::Iterator objectIt = objects.begin();
        while (objectIt != objects.end()) {
            if (*objectIt != rtFrame) {
                delete *objectIt;
                objectIt = objects.erase(objectIt);
            } else {
                ++objectIt;
            }
        }
        // also clear out the remaining root frame pointer
        // (we're going to delete the object further down)
        objects.clear();

        title.clear();
        clearUndoRedoStacks(QTextDocument::UndoAndRedoStacks);
        text = QString();
        unreachableCharacterCount = 0;
        modifiedState = 0;
        modified = false;
        formats.clear();
        int len = fragments.length();
        fragments.clear();
        blocks.clear();
        cachedResources.clear();
        delete rtFrame;
        rtFrame = nullptr;
        init();
        cursors = oldCursors;
        {
            QScopedValueRollback<bool> bg(inContentsChange, true);
            emit q->contentsChange(0, len, 0);
        }
        if (lout)
            lout->documentChanged(0, len, 0);
    }